

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

PacketBuilder * __thiscall PacketBuilder::AddShort(PacketBuilder *this,unsigned_short num)

{
  pointer pvVar1;
  array<unsigned_char,_4UL> local_16;
  unsigned_short local_12;
  PacketBuilder *pPStack_10;
  unsigned_short num_local;
  PacketBuilder *this_local;
  
  local_12 = num;
  pPStack_10 = this;
  local_16 = PacketProcessor::ENumber((uint)num);
  pvVar1 = std::array<unsigned_char,_4UL>::data(&local_16);
  std::__cxx11::string::append((char *)&this->data,(ulong)pvVar1);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddShort(unsigned short num)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	this->data.append((char *)PacketProcessor::ENumber(num).data(), 2);

#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}